

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeFragments
          (VertexVaryingShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int fragNdx_1;
  FragmentPacket *pFVar3;
  long lVar4;
  ulong uVar5;
  int fragNdx;
  int iVar6;
  int iVar7;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  FragmentPacket *local_60;
  ulong local_58;
  VertexVaryingShader *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < numPackets) {
    local_58 = (ulong)(uint)numPackets;
    iVar7 = 0;
    uVar5 = 0;
    local_60 = packets;
    local_50 = this;
    do {
      iVar6 = local_50->m_geometryOut;
      if (iVar6 == 0) {
        pGVar1 = context->outputArray;
        iVar6 = context->numFragmentOutputs;
        iVar2 = iVar6 * iVar7;
        lVar4 = 4;
        do {
          *(undefined8 *)&pGVar1[iVar2].v = 0x3f800000;
          *(undefined8 *)((long)&pGVar1[iVar2].v + 8) = 0x3f80000000000000;
          iVar2 = iVar2 + iVar6;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      else if (iVar6 == 1) {
        pFVar3 = local_60 + uVar5;
        iVar6 = 0;
        do {
          rr::readTriangleVarying<float>((rr *)&local_78,pFVar3,context,0,iVar6);
          pGVar1 = context->outputArray;
          iVar2 = (iVar7 + iVar6) * context->numFragmentOutputs;
          pGVar1[iVar2].v.uData[0] = (deUint32)local_78;
          pGVar1[iVar2].v.uData[1] = (deUint32)fStack_74;
          pGVar1[iVar2].v.uData[2] = (deUint32)fStack_70;
          pGVar1[iVar2].v.uData[3] = (deUint32)fStack_6c;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 4);
      }
      else if (iVar6 == 2) {
        pFVar3 = local_60 + uVar5;
        iVar6 = 0;
        do {
          rr::readTriangleVarying<float>((rr *)&local_78,pFVar3,context,0,iVar6);
          rr::readTriangleVarying<float>((rr *)&local_48,pFVar3,context,1,iVar6);
          pGVar1 = context->outputArray + (iVar7 + iVar6) * context->numFragmentOutputs;
          (pGVar1->v).fData[0] = fStack_44 + local_78;
          (pGVar1->v).fData[1] = local_48 + fStack_74;
          (pGVar1->v).fData[2] = fStack_40 + fStack_70;
          (pGVar1->v).fData[3] = fStack_3c + fStack_6c;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 4);
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 4;
    } while (uVar5 != local_58);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		switch (m_geometryOut)
		{
			case 0:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
				break;

			case 1:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx));
				break;

			case 2:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0,   rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx)
					                                                        + rr::readTriangleVarying<float>(packets[packetNdx], context, 1, fragNdx).swizzle(1, 0, 2, 3));
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}